

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

void __thiscall
llm_graph_input_attn_kv_unified::set_input
          (llm_graph_input_attn_kv_unified *this,llama_ubatch *ubatch)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  const_reference pvVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long in_RSI;
  llama_seq_id *in_RDI;
  int j_2;
  int i_2;
  int j_1;
  int i_1;
  llama_pos pos_chunk_start;
  float f;
  int i;
  llama_pos pos;
  int j;
  llama_seq_id seq_id;
  int s;
  int h;
  float *data_swa;
  float *data;
  int64_t n_seqs;
  int64_t n_seq_tokens;
  int64_t n_tokens;
  int64_t n_kv;
  int in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint uVar10;
  int local_68;
  uint local_64;
  float local_5c;
  int local_58;
  int local_50;
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  
  if ((*(long *)(in_RDI + 2) != 0) || (*(long *)(in_RDI + 6) != 0)) {
    uVar7 = (ulong)*(uint *)(*(long *)(in_RDI + 0xe) + 0x74);
    uVar1 = *(uint *)(in_RSI + 4);
    uVar8 = (ulong)uVar1;
    uVar9 = (ulong)*(uint *)(in_RSI + 8);
    uVar2 = *(uint *)(in_RSI + 0xc);
    local_38 = 0;
    local_40 = 0;
    if (*(long *)(in_RDI + 2) != 0) {
      uVar4 = ggml_backend_buffer_is_host(*(undefined8 *)(*(long *)(in_RDI + 2) + 8));
      if ((uVar4 & 1) == 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,0x1ae,"GGML_ASSERT(%s) failed",
                   "ggml_backend_buffer_is_host(self_kq_mask->buffer)");
      }
      local_38 = *(long *)(*(long *)(in_RDI + 2) + 0xf8);
    }
    if (*(long *)(in_RDI + 6) != 0) {
      uVar4 = ggml_backend_buffer_is_host(*(undefined8 *)(*(long *)(in_RDI + 6) + 8));
      if ((uVar4 & 1) == 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,0x1b3,"GGML_ASSERT(%s) failed",
                   "ggml_backend_buffer_is_host(self_kq_mask_swa->buffer)");
      }
      local_40 = *(long *)(*(long *)(in_RDI + 6) + 0xf8);
    }
    for (local_44 = 0; local_44 < 1; local_44 = local_44 + 1) {
      for (local_48 = 0; (long)local_48 < (long)(ulong)uVar2; local_48 = local_48 + 1) {
        for (local_50 = 0; (long)local_50 < (long)uVar9; local_50 = local_50 + 1) {
          uVar10 = *(uint *)(*(long *)(in_RSI + 0x20) +
                            ((long)local_48 * uVar9 + (long)local_50) * 4);
          for (local_58 = 0; (long)local_58 < (long)uVar7; local_58 = local_58 + 1) {
            std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                      ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                       (*(long *)(in_RDI + 0xe) + 0x78),(long)local_58);
            bVar3 = llama_kv_cell::has_seq_id
                              ((llama_kv_cell *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI)
            ;
            if ((bVar3) &&
               (((*(byte *)(*(long *)(in_RDI + 0xc) + 0x39) & 1) == 0 ||
                (pvVar5 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                                    ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                     (*(long *)(in_RDI + 0xe) + 0x78),(long)local_58),
                pvVar5->pos <= (int)uVar10)))) {
              if ((*(byte *)(*(long *)(in_RDI + 10) + 0x1905) & 1) == 0) {
                local_5c = 0.0;
              }
              else {
                pvVar5 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                                   ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                    (*(long *)(in_RDI + 0xe) + 0x78),(long)local_58);
                iVar6 = pvVar5->pos - uVar10;
                if (iVar6 < 1) {
                  iVar6 = -iVar6;
                }
                local_5c = (float)-iVar6;
              }
            }
            else {
              local_5c = -INFINITY;
            }
            if (local_38 != 0) {
              *(float *)(local_38 +
                        ((long)local_44 * uVar7 * uVar8 + (long)local_48 * uVar7 * uVar9 +
                         (long)local_50 * uVar7 + (long)local_58) * 4) = local_5c;
            }
            if (local_40 != 0) {
              if (*(int *)(*(long *)(in_RDI + 10) + 0x1910) == 0) {
                pvVar5 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                                   ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                    (*(long *)(in_RDI + 0xe) + 0x78),(long)local_58);
                if (*(int *)(*(long *)(in_RDI + 10) + 0x18) <= (int)(uVar10 - pvVar5->pos)) {
                  local_5c = -INFINITY;
                }
              }
              else {
                iVar6 = (uVar10 / *(uint *)(*(long *)(in_RDI + 10) + 0x1910)) *
                        *(int *)(*(long *)(in_RDI + 10) + 0x1910);
                pvVar5 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                                   ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)
                                    (*(long *)(in_RDI + 0xe) + 0x78),(long)local_58);
                if ((pvVar5->pos < iVar6) || ((int)uVar10 < iVar6)) {
                  local_5c = -INFINITY;
                }
              }
              *(float *)(local_40 +
                        ((long)local_44 * uVar7 * uVar8 + (long)local_48 * uVar7 * uVar9 +
                         (long)local_50 * uVar7 + (long)local_58) * 4) = local_5c;
            }
          }
        }
      }
      local_64 = uVar1;
      if (local_38 != 0) {
        for (; (long)(int)local_64 < (long)(uVar8 + 0x3f & 0xffffffffffffffc0);
            local_64 = local_64 + 1) {
          for (local_68 = 0; (long)local_68 < (long)uVar7; local_68 = local_68 + 1) {
            *(undefined4 *)
             (local_38 +
             ((long)local_44 * uVar7 * uVar8 + (long)(int)local_64 * uVar7 + (long)local_68) * 4) =
                 0xff800000;
          }
        }
      }
      uVar10 = uVar1;
      if (local_40 != 0) {
        for (; in_stack_ffffffffffffff94 = uVar10,
            (long)(int)uVar10 < (long)(uVar8 + 0x3f & 0xffffffffffffffc0); uVar10 = uVar10 + 1) {
          for (in_stack_ffffffffffffff90 = 0; (long)in_stack_ffffffffffffff90 < (long)uVar7;
              in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1) {
            *(undefined4 *)
             (local_40 +
             ((long)local_44 * uVar7 * uVar8 + (long)(int)uVar10 * uVar7 +
             (long)in_stack_ffffffffffffff90) * 4) = 0xff800000;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void llm_graph_input_attn_kv_unified::set_input(const llama_ubatch * ubatch) {
    if (self_kq_mask || self_kq_mask_swa) {
        const int64_t n_kv         = kv_self->n;
        const int64_t n_tokens     = ubatch->n_tokens;
        const int64_t n_seq_tokens = ubatch->n_seq_tokens;
        const int64_t n_seqs       = ubatch->n_seqs;

        float * data     = nullptr;
        float * data_swa = nullptr;

        if (self_kq_mask) {
            GGML_ASSERT(ggml_backend_buffer_is_host(self_kq_mask->buffer));
            data = (float *) self_kq_mask->data;
        }

        if (self_kq_mask_swa) {
            GGML_ASSERT(ggml_backend_buffer_is_host(self_kq_mask_swa->buffer));
            data_swa = (float *) self_kq_mask_swa->data;
        }

        // Use only the previous KV cells of the correct sequence for each token of the ubatch.
        // It's assumed that if a token in the batch has multiple sequences, they are equivalent.
        // Example with a cache of 10 tokens, 2 tokens populated in cache and 3 tokens in batch:
        //   Causal mask:
        //      xxx-------
        //      xxxx------
        //      xxxxx-----
        //   Non-causal mask:
        //      xxxxx-----
        //      xxxxx-----
        //      xxxxx-----
        // To visualize the mask, see https://github.com/ggml-org/llama.cpp/pull/12615
        for (int h = 0; h < 1; ++h) {
            for (int s = 0; s < n_seqs; ++s) {
                const llama_seq_id seq_id = ubatch->seq_id[s][0];

                for (int j = 0; j < n_seq_tokens; ++j) {
                    const llama_pos pos = ubatch->pos[s*n_seq_tokens + j];
                    for (int i = 0; i < n_kv; ++i) {
                        float f;
                        // mask the token if:
                        if (!kv_self->cells[i].has_seq_id(seq_id) // not the correct sequence
                            || (cparams.causal_attn && kv_self->cells[i].pos > pos) // for causal, mask future tokens
                        ) {
                            f = -INFINITY;
                        } else {
                            if (hparams.use_alibi) {
                                f = -std::abs(kv_self->cells[i].pos - pos);
                            } else {
                                f = 0.0f;
                            }
                        }

                        if (data) {
                            data[h*(n_kv*n_tokens) + s*(n_kv*n_seq_tokens) + j*n_kv + i] = f;
                        }

                        // may need to cut off old tokens for sliding window
                        // TODO @ngxson : we are currently re-using the swa logic to store the chunked mask, we should rename SWA to something more generic like "aux mask"
                        if (data_swa) {
                            if (hparams.n_attn_chunk) {
                                llama_pos pos_chunk_start = (pos / hparams.n_attn_chunk) * hparams.n_attn_chunk;
                                if (kv_self->cells[i].pos < pos_chunk_start || pos < pos_chunk_start) {
                                    f = -INFINITY;
                                }
                            } else {
                                if (pos - kv_self->cells[i].pos >= (int32_t)hparams.n_swa) {
                                    f = -INFINITY;
                                }
                            }
                            data_swa[h*(n_kv*n_tokens) + s*(n_kv*n_seq_tokens) + j*n_kv + i] = f;
                        }
                    }
                }
            }

            // mask padded tokens
            if (data) {
                for (int i = n_tokens; i < GGML_PAD(n_tokens, GGML_KQ_MASK_PAD); ++i) {
                    for (int j = 0; j < n_kv; ++j) {
                        data[h*(n_kv*n_tokens) + i*n_kv + j] = -INFINITY;
                    }
                }
            }

            // mask padded tokens
            if (data_swa) {
                for (int i = n_tokens; i < GGML_PAD(n_tokens, GGML_KQ_MASK_PAD); ++i) {
                    for (int j = 0; j < n_kv; ++j) {
                        data_swa[h*(n_kv*n_tokens) + i*n_kv + j] = -INFINITY;
                    }
                }
            }
        }
    }
}